

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecUtil.c
# Opt level: O0

void Gia_PolynCollectXors_rec(Gia_Man_t *pGia,int iObj,Vec_Int_t *vXors)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  Vec_Int_t *vXors_local;
  int iObj_local;
  Gia_Man_t *pGia_local;
  
  pObj_00 = Gia_ManObj(pGia,iObj);
  iVar1 = Gia_ObjIsTravIdCurrent(pGia,pObj_00);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(pGia,pObj_00);
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if (((iVar1 != 0) && (iVar1 = Gia_ObjIsXor(pObj_00), iVar1 != 0)) &&
       (iVar1 = Gia_ObjRefNum(pGia,pObj_00), iVar1 < 2)) {
      iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
      Gia_PolynCollectXors_rec(pGia,iVar1,vXors);
      iVar1 = Gia_ObjFaninId1(pObj_00,iObj);
      Gia_PolynCollectXors_rec(pGia,iVar1,vXors);
      Vec_IntPushUnique(vXors,iObj);
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_PolynCollectXors_rec( Gia_Man_t * pGia, int iObj, Vec_Int_t * vXors )
{
    Gia_Obj_t * pObj = Gia_ManObj( pGia, iObj );
    if ( Gia_ObjIsTravIdCurrent(pGia, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(pGia, pObj);
    if ( !Gia_ObjIsAnd(pObj) || !Gia_ObjIsXor(pObj) || Gia_ObjRefNum(pGia, pObj) > 1 )
        return;
    Gia_PolynCollectXors_rec( pGia, Gia_ObjFaninId0(pObj, iObj), vXors );
    Gia_PolynCollectXors_rec( pGia, Gia_ObjFaninId1(pObj, iObj), vXors );
    Vec_IntPushUnique( vXors, iObj );
}